

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tandem.cpp
# Opt level: O3

vector<unsigned_int,_std::allocator<unsigned_int>_> *
tandem::make_rank_array
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *suffix_array,size_t extra_capacity)

{
  pointer puVar1;
  pointer puVar2;
  size_t sVar3;
  ulong uVar4;
  allocator_type local_19;
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (__return_storage_ptr__,
             ((long)(suffix_array->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(suffix_array->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                    _M_impl.super__Vector_impl_data._M_start >> 2) - extra_capacity,&local_19);
  puVar1 = (suffix_array->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  sVar3 = (long)(suffix_array->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                _M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 2;
  if (sVar3 != extra_capacity) {
    puVar2 = (__return_storage_ptr__->
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar4 = 0;
    do {
      puVar2[puVar1[uVar4]] = (uint)uVar4;
      uVar4 = uVar4 + 1;
    } while ((uVar4 & 0xffffffff) < sVar3 - extra_capacity);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::uint32_t> make_rank_array(const std::vector<std::uint32_t>& suffix_array,
                                           const std::size_t extra_capacity)
{
    std::vector<std::uint32_t> result(suffix_array.size() - extra_capacity);
    for (std::uint32_t i {0}; i < (suffix_array.size() - extra_capacity); ++i) {
        result[suffix_array[i]] = i;
    }
    return result;
}